

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O1

long __thiscall glcts::BasicProgramQuery::Run(BasicProgramQuery *this)

{
  CallLogWrapper *this_00;
  undefined1 *buffers;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  bool bVar3;
  GLuint GVar4;
  mapped_type *pmVar5;
  float *pfVar6;
  GLuint *buffers_00;
  long lVar7;
  uint data [8];
  GLuint active_uniforms;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  uniforms_name_index;
  GLuint active_buffers;
  GLint in_stack_ffffffffffffff50;
  key_type local_a8;
  uint local_7c;
  undefined1 local_78 [32];
  _Base_ptr local_58;
  size_t local_50;
  uint local_44;
  pair<char_*,_unsigned_int> local_40;
  
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout(std430) buffer Output {\n  mediump vec4 data;\n} g_out;\nlayout(binding = 0, offset = 0)  uniform atomic_uint ac_counter0;\nlayout(binding = 0, offset = 4)  uniform atomic_uint ac_counter1;\nlayout(binding = 0)              uniform atomic_uint ac_counter2;\nlayout(binding = 0)              uniform atomic_uint ac_counter67[2];\nlayout(binding = 0)              uniform atomic_uint ac_counter3;\nlayout(binding = 0)              uniform atomic_uint ac_counter4;\nlayout(binding = 0)              uniform atomic_uint ac_counter5;\nvoid main() {\n  mediump uint c = 0u;\n  c += atomicCounterIncrement(ac_counter0);\n  c += atomicCounterIncrement(ac_counter1);\n  c += atomicCounterIncrement(ac_counter2);\n  c += atomicCounterIncrement(ac_counter3);\n  c += atomicCounterIncrement(ac_counter4);\n  c += atomicCounterIncrement(ac_counter5);\n  c += atomicCounterIncrement(ac_counter67[0]);\n  c += atomicCounterIncrement(ac_counter67[1]);\n  if (c > 10u) g_out.data = vec4(0.0, 1.0, 0.0, 1.0);\n  else g_out.data = vec4(1.0, float(c), 0.0, 1.0);\n}"
             ,"");
  GVar4 = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,(string *)local_78);
  this->prog_ = GVar4;
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  this_00 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->prog_);
  bVar3 = BasicUsageCS::CheckProgram(&this->super_BasicUsageCS,this->prog_,(bool *)0x0);
  lVar7 = -1;
  if (bVar3) {
    glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
    glu::CallLogWrapper::glGetProgramiv(this_00,this->prog_,0x92d9,(GLint *)&local_44);
    if (local_44 == 1) {
      local_78._24_8_ = local_78 + 8;
      local_78._8_4_ = _S_red;
      local_78._16_8_ = 0;
      local_50 = 0;
      local_58 = (_Base_ptr)local_78._24_8_;
      glu::CallLogWrapper::glGetProgramiv(this_00,this->prog_,0x8b86,(GLint *)&local_7c);
      if (local_7c == 7) {
        GVar4 = 0;
        do {
          glu::CallLogWrapper::glGetProgramResourceName
                    (this_00,this->prog_,0x92e1,GVar4,0x20,(GLsizei *)0x0,(GLchar *)&local_a8);
          local_40.first = (char *)&local_a8;
          local_40.second = GVar4;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
          ::_M_emplace_unique<std::pair<char*,unsigned_int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                      *)local_78,&local_40);
          GVar4 = GVar4 + 1;
        } while (GVar4 < local_7c);
        GVar4 = this->prog_;
        paVar1 = &local_a8.field_2;
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ac_counter0","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)local_78,&local_a8);
        bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                          ((SACSubcaseBase *)this,GVar4,"ac_counter0",*pmVar5,1,0,0,
                           in_stack_ffffffffffffff50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        lVar7 = -1;
        if (bVar3) {
          GVar4 = this->prog_;
          local_a8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ac_counter1","");
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 *)local_78,&local_a8);
          bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                            ((SACSubcaseBase *)this,GVar4,"ac_counter1",*pmVar5,1,4,0,
                             in_stack_ffffffffffffff50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (bVar3) {
            GVar4 = this->prog_;
            local_a8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ac_counter2","");
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   *)local_78,&local_a8);
            bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                              ((SACSubcaseBase *)this,GVar4,"ac_counter2",*pmVar5,1,8,0,
                               in_stack_ffffffffffffff50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if (bVar3) {
              GVar4 = this->prog_;
              local_a8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ac_counter3","");
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                     *)local_78,&local_a8);
              bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                                ((SACSubcaseBase *)this,GVar4,"ac_counter3",*pmVar5,1,0x14,0,
                                 in_stack_ffffffffffffff50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar1) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if (bVar3) {
                GVar4 = this->prog_;
                local_a8._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,"ac_counter4","");
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                       *)local_78,&local_a8);
                bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                                  ((SACSubcaseBase *)this,GVar4,"ac_counter4",*pmVar5,1,0x18,0,
                                   in_stack_ffffffffffffff50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                }
                if (bVar3) {
                  GVar4 = this->prog_;
                  local_a8._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_a8,"ac_counter5","");
                  pmVar5 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                         *)local_78,&local_a8);
                  bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                                    ((SACSubcaseBase *)this,GVar4,"ac_counter5",*pmVar5,1,0x1c,0,
                                     in_stack_ffffffffffffff50);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_a8._M_dataplus._M_p,
                                    local_a8.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar3) {
                    GVar4 = this->prog_;
                    local_a8._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_a8,"ac_counter67[0]","");
                    pmVar5 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                           *)local_78,&local_a8);
                    bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                                      ((SACSubcaseBase *)this,GVar4,"ac_counter67[0]",*pmVar5,2,0xc,
                                       4,in_stack_ffffffffffffff50);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_a8._M_dataplus._M_p,
                                      local_a8.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar3) {
                      buffers = &(this->super_BasicUsageCS).field_0x34;
                      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)buffers);
                      glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,*(GLuint *)buffers);
                      local_a8.field_2._M_allocated_capacity = 0x1400000014;
                      local_a8.field_2._8_8_ = 0x1400000014;
                      local_a8._M_dataplus._M_p = (pointer)0x1400000014;
                      local_a8._M_string_length = 0x1400000014;
                      glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x20,&local_a8,0x88e8);
                      glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
                      buffers_00 = &this->m_buffer;
                      glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_00);
                      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*buffers_00);
                      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,(void *)0x0,0x88e8);
                      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
                      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
                      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers_00);
                      glu::CallLogWrapper::glMemoryBarrier(this_00,0x1200);
                      pfVar6 = (float *)glu::CallLogWrapper::glMapBufferRange
                                                  (this_00,0x90d2,0,0x10,1);
                      fVar2 = *pfVar6;
                      if (((((fVar2 != 0.0) || (NAN(fVar2))) || (pfVar6[1] != 1.0)) ||
                          ((NAN(pfVar6[1]) || (pfVar6[2] != 0.0)))) ||
                         ((NAN(pfVar6[2]) || ((pfVar6[3] != 1.0 || (NAN(pfVar6[3]))))))) {
                        lVar7 = -1;
                        glcts::anon_unknown_0::Output
                                  ("Expected vec4(0, 1, 0, 1) in the buffer, got: %f %f %f %f\n",
                                   SUB84((double)fVar2,0),(double)pfVar6[1],(double)pfVar6[2],
                                   (double)pfVar6[3]);
                      }
                      else {
                        lVar7 = 0;
                      }
                      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
                      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        lVar7 = -1;
        glcts::anon_unknown_0::Output("GL_ACTIVE_UNIFORMS is %u should be %d.\n",(ulong)local_7c,8);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)local_78);
    }
    else {
      glcts::anon_unknown_0::Output
                ("GL_ACTIVE_ATOMIC_COUNTER_BUFFERS is %u should be %d.\n",(ulong)local_44,1);
      lVar7 = -1;
    }
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{

		// create program
		const char* glsl_cs =
			NL "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;" NL "layout(std430) buffer Output {" NL
			   "  mediump vec4 data;" NL "} g_out;" NL
			   "layout(binding = 0, offset = 0)  uniform atomic_uint ac_counter0;" NL
			   "layout(binding = 0, offset = 4)  uniform atomic_uint ac_counter1;" NL
			   "layout(binding = 0)              uniform atomic_uint ac_counter2;" NL
			   "layout(binding = 0)              uniform atomic_uint ac_counter67[2];" NL
			   "layout(binding = 0)              uniform atomic_uint ac_counter3;" NL
			   "layout(binding = 0)              uniform atomic_uint ac_counter4;" NL
			   "layout(binding = 0)              uniform atomic_uint ac_counter5;" NL "void main() {" NL
			   "  mediump uint c = 0u;" NL "  c += atomicCounterIncrement(ac_counter0);" NL
			   "  c += atomicCounterIncrement(ac_counter1);" NL "  c += atomicCounterIncrement(ac_counter2);" NL
			   "  c += atomicCounterIncrement(ac_counter3);" NL "  c += atomicCounterIncrement(ac_counter4);" NL
			   "  c += atomicCounterIncrement(ac_counter5);" NL "  c += atomicCounterIncrement(ac_counter67[0]);" NL
			   "  c += atomicCounterIncrement(ac_counter67[1]);" NL
			   "  if (c > 10u) g_out.data = vec4(0.0, 1.0, 0.0, 1.0);" NL
			   "  else g_out.data = vec4(1.0, float(c), 0.0, 1.0);" NL "}";

		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;
		glUseProgram(prog_);

		// get active buffers
		GLuint active_buffers;
		glGetProgramiv(prog_, GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, reinterpret_cast<GLint*>(&active_buffers));
		if (active_buffers != 1)
		{
			Output("GL_ACTIVE_ATOMIC_COUNTER_BUFFERS is %u should be %d.\n", active_buffers, 1);
			return ERROR;
		}

		// get active uniforms
		std::map<std::string, GLuint> uniforms_name_index;
		GLuint active_uniforms;
		glGetProgramiv(prog_, GL_ACTIVE_UNIFORMS, reinterpret_cast<GLint*>(&active_uniforms));
		if (active_uniforms != 7)
		{
			Output("GL_ACTIVE_UNIFORMS is %u should be %d.\n", active_uniforms, 8);
			return ERROR;
		}
		for (GLuint index = 0; index < active_uniforms; ++index)
		{
			GLchar name[32];
			glGetProgramResourceName(prog_, GL_UNIFORM, index, sizeof(name), NULL, name);
			uniforms_name_index.insert(std::make_pair(name, index));
		}

		if (!CheckUniform(prog_, "ac_counter0", uniforms_name_index["ac_counter0"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  0, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter1", uniforms_name_index["ac_counter1"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  4, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter2", uniforms_name_index["ac_counter2"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  8, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter3", uniforms_name_index["ac_counter3"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  20, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter4", uniforms_name_index["ac_counter4"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  24, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter5", uniforms_name_index["ac_counter5"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  28, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter67[0]", uniforms_name_index["ac_counter67[0]"],
						  GL_UNSIGNED_INT_ATOMIC_COUNTER, 2, 12, 4))
			return ERROR;

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		const unsigned int data[8] = { 20, 20, 20, 20, 20, 20, 20, 20 };
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(Vec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glDispatchCompute(1, 1, 1);

		long  error = NO_ERROR;
		Vec4* data_out;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT | GL_ATOMIC_COUNTER_BARRIER_BIT);
		data_out = static_cast<Vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Vec4), GL_MAP_READ_BIT));
		if (data_out[0].x() != 0.0 || data_out[0].y() != 1.0 || data_out[0].z() != 0.0 || data_out[0].w() != 1.0)
		{
			Output("Expected vec4(0, 1, 0, 1) in the buffer, got: %f %f %f %f\n", data_out[0].x(), data_out[0].y(),
				   data_out[0].z(), data_out[0].w());
			error = ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return error;
	}